

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_field *field)

{
  ostream *poVar1;
  t_type *type;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if ((field->super_t_doc).has_doc_ == true) {
    poVar1 = std::operator<<(&local_198,(string *)&(field->super_t_doc).doc_);
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  }
  type = t_type::get_true_type(field->type_);
  poVar1 = std::operator<<(&local_198,"@var ");
  type_to_phpdoc_abi_cxx11_(&local_1c8,this,type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  generate_php_docstring_comment(this,out,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_field* field) {
  stringstream ss;

  // prepend free-style doc if available
  if (field->has_doc()) {
    ss << field->get_doc() << endl;
  }

  // append @var tag
  t_type* type = get_true_type(field->get_type());
  ss << "@var " << type_to_phpdoc(type) << endl;

  generate_php_docstring_comment(out, ss.str());
}